

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O1

REF_STATUS ref_cavity_verify_face_manifold(REF_CAVITY ref_cavity)

{
  int node1;
  undefined8 uVar1;
  char *pcVar2;
  long lVar3;
  long lVar4;
  REF_INT found_face;
  int local_2c;
  
  if ((ref_cavity->state != REF_CAVITY_INCONSISTENT) && (0 < ref_cavity->maxface)) {
    lVar4 = 0;
    lVar3 = 0;
    do {
      node1 = *(int *)((long)ref_cavity->f2n + lVar4);
      if (node1 != -1) {
        ref_cavity_find_face_with_side
                  (ref_cavity,*(REF_INT *)((long)ref_cavity->f2n + lVar4 + 4),node1,&local_2c);
        if (ref_cavity->state == REF_CAVITY_INCONSISTENT) {
          return 0;
        }
        if (local_2c == -1) {
          pcVar2 = "side 01 missing";
          uVar1 = 0x1dc;
LAB_001ae52d:
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
                 uVar1,"ref_cavity_verify_face_manifold",pcVar2);
          return 1;
        }
        ref_cavity_find_face_with_side
                  (ref_cavity,*(REF_INT *)((long)ref_cavity->f2n + lVar4 + 8),
                   *(REF_INT *)((long)ref_cavity->f2n + lVar4 + 4),&local_2c);
        if (ref_cavity->state == REF_CAVITY_INCONSISTENT) {
          return 0;
        }
        if (local_2c == -1) {
          pcVar2 = "side 12 missing";
          uVar1 = 0x1e3;
          goto LAB_001ae52d;
        }
        ref_cavity_find_face_with_side
                  (ref_cavity,*(REF_INT *)((long)ref_cavity->f2n + lVar4),
                   *(REF_INT *)((long)ref_cavity->f2n + lVar4 + 8),&local_2c);
        if (ref_cavity->state == REF_CAVITY_INCONSISTENT) {
          return 0;
        }
        if (local_2c == -1) {
          pcVar2 = "side 20 missing";
          uVar1 = 0x1ea;
          goto LAB_001ae52d;
        }
      }
      lVar3 = lVar3 + 1;
      lVar4 = lVar4 + 0xc;
    } while (lVar3 < ref_cavity->maxface);
  }
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_cavity_verify_face_manifold(
    REF_CAVITY ref_cavity) {
  REF_INT face, found_face;

  if (REF_CAVITY_INCONSISTENT == ref_cavity_state(ref_cavity))
    return REF_SUCCESS;

  each_ref_cavity_valid_face(ref_cavity, face) {
    RSS(ref_cavity_find_face_with_side(
            ref_cavity, ref_cavity_f2n(ref_cavity, 1, face),
            ref_cavity_f2n(ref_cavity, 0, face), &found_face),
        "find side 01");
    if (REF_CAVITY_INCONSISTENT == ref_cavity_state(ref_cavity))
      return REF_SUCCESS;
    RUS(REF_EMPTY, found_face, "side 01 missing");
    RSS(ref_cavity_find_face_with_side(
            ref_cavity, ref_cavity_f2n(ref_cavity, 2, face),
            ref_cavity_f2n(ref_cavity, 1, face), &found_face),
        "find side 12");
    if (REF_CAVITY_INCONSISTENT == ref_cavity_state(ref_cavity))
      return REF_SUCCESS;
    RUS(REF_EMPTY, found_face, "side 12 missing");
    RSS(ref_cavity_find_face_with_side(
            ref_cavity, ref_cavity_f2n(ref_cavity, 0, face),
            ref_cavity_f2n(ref_cavity, 2, face), &found_face),
        "find side 20");
    if (REF_CAVITY_INCONSISTENT == ref_cavity_state(ref_cavity))
      return REF_SUCCESS;
    RUS(REF_EMPTY, found_face, "side 20 missing");
  }

  return REF_SUCCESS;
}